

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O0

void __thiscall HashUtil_Ripemd160_Test::TestBody(HashUtil_Ripemd160_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_350;
  Message local_348;
  string local_340;
  undefined1 local_320 [8];
  AssertionResult gtest_ar_4;
  string local_308;
  Script local_2e8;
  ByteData160 local_2b0;
  AssertHelper local_298;
  Message local_290;
  string local_288;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_3;
  string local_250;
  Pubkey local_230;
  ByteData160 local_218;
  AssertHelper local_200;
  Message local_1f8;
  string local_1f0;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_2;
  string local_1b8;
  ByteData256 local_198;
  ByteData160 local_180;
  AssertHelper local_168;
  Message local_160;
  string local_158;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_1;
  string local_120;
  ByteData160 local_100;
  ByteData160 local_e8;
  AssertHelper local_d0;
  Message local_c8;
  string local_c0;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  allocator local_79;
  string local_78;
  ByteData local_58;
  ByteData160 local_40;
  undefined1 local_28 [8];
  ByteData160 byte_data;
  HashUtil_Ripemd160_Test *this_local;
  
  byte_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  cfd::core::ByteData160::ByteData160((ByteData160 *)local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"0123456789abcdef",&local_79);
  cfd::core::ByteData::ByteData(&local_58,&local_78);
  cfd::core::HashUtil::Ripemd160(&local_40,&local_58);
  cfd::core::ByteData160::operator=((ByteData160 *)local_28,&local_40);
  cfd::core::ByteData160::~ByteData160(&local_40);
  cfd::core::ByteData::~ByteData(&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  cfd::core::ByteData160::GetHex_abi_cxx11_(&local_c0,(ByteData160 *)local_28);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_a0,"byte_data.GetHex().c_str()",
             "\"cea1b21f1a739fba68d1d4290437d2c5609be1d3\"",pcVar2,
             "cea1b21f1a739fba68d1d4290437d2c5609be1d3");
  std::__cxx11::string::~string((string *)&local_c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hashutil.cpp"
               ,0x27,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_120,"0123456789abcdef0123456789abcdef01234567",
             (allocator *)((long)&gtest_ar_1.message_.ptr_ + 7));
  cfd::core::ByteData160::ByteData160(&local_100,&local_120);
  cfd::core::HashUtil::Ripemd160(&local_e8,&local_100);
  cfd::core::ByteData160::operator=((ByteData160 *)local_28,&local_e8);
  cfd::core::ByteData160::~ByteData160(&local_e8);
  cfd::core::ByteData160::~ByteData160(&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  cfd::core::ByteData160::GetHex_abi_cxx11_(&local_158,(ByteData160 *)local_28);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_138,"byte_data.GetHex().c_str()",
             "\"49ec9207a365f6f330d529ca2a79e23a7ea2b526\"",pcVar2,
             "49ec9207a365f6f330d529ca2a79e23a7ea2b526");
  std::__cxx11::string::~string((string *)&local_158);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hashutil.cpp"
               ,0x2a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1b8,"1234567890123456789012345678901234567890123456789012345678901234"
             ,(allocator *)((long)&gtest_ar_2.message_.ptr_ + 7));
  cfd::core::ByteData256::ByteData256(&local_198,&local_1b8);
  cfd::core::HashUtil::Ripemd160(&local_180,&local_198);
  cfd::core::ByteData160::operator=((ByteData160 *)local_28,&local_180);
  cfd::core::ByteData160::~ByteData160(&local_180);
  cfd::core::ByteData256::~ByteData256(&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_2.message_.ptr_ + 7));
  cfd::core::ByteData160::GetHex_abi_cxx11_(&local_1f0,(ByteData160 *)local_28);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1d0,"byte_data.GetHex().c_str()",
             "\"a5b1c86f10c81c3c543304e9891815d8de036296\"",pcVar2,
             "a5b1c86f10c81c3c543304e9891815d8de036296");
  std::__cxx11::string::~string((string *)&local_1f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hashutil.cpp"
               ,0x2d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_250,
             "032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db",
             (allocator *)((long)&gtest_ar_3.message_.ptr_ + 7));
  cfd::core::Pubkey::Pubkey(&local_230,&local_250);
  cfd::core::HashUtil::Ripemd160(&local_218,&local_230);
  cfd::core::ByteData160::operator=((ByteData160 *)local_28,&local_218);
  cfd::core::ByteData160::~ByteData160(&local_218);
  cfd::core::Pubkey::~Pubkey(&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_3.message_.ptr_ + 7));
  cfd::core::ByteData160::GetHex_abi_cxx11_(&local_288,(ByteData160 *)local_28);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_268,"byte_data.GetHex().c_str()",
             "\"1c8eae98d10ae2eb0ce0a99d446f0156c6f596ca\"",pcVar2,
             "1c8eae98d10ae2eb0ce0a99d446f0156c6f596ca");
  std::__cxx11::string::~string((string *)&local_288);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar1) {
    testing::Message::Message(&local_290);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
    testing::internal::AssertHelper::AssertHelper
              (&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hashutil.cpp"
               ,0x30,pcVar2);
    testing::internal::AssertHelper::operator=(&local_298,&local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_298);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_308,
             "21026dccc749adc2a9d0d89497ac511f760f45c47dc5ed9cf352a58ac706453880aeadab210255a9626aebf5e29c0e6538428ba0d1dcf6ca98ffdf086aa8ced5e0d0215ea465ac"
             ,(allocator *)((long)&gtest_ar_4.message_.ptr_ + 7));
  cfd::core::Script::Script(&local_2e8,&local_308);
  cfd::core::HashUtil::Ripemd160(&local_2b0,&local_2e8);
  cfd::core::ByteData160::operator=((ByteData160 *)local_28,&local_2b0);
  cfd::core::ByteData160::~ByteData160(&local_2b0);
  cfd::core::Script::~Script(&local_2e8);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_4.message_.ptr_ + 7));
  cfd::core::ByteData160::GetHex_abi_cxx11_(&local_340,(ByteData160 *)local_28);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_320,"byte_data.GetHex().c_str()",
             "\"6be854f95bade5490a020c3841c50d08339a5c89\"",pcVar2,
             "6be854f95bade5490a020c3841c50d08339a5c89");
  std::__cxx11::string::~string((string *)&local_340);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
  if (!bVar1) {
    testing::Message::Message(&local_348);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
    testing::internal::AssertHelper::AssertHelper
              (&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hashutil.cpp"
               ,0x33,pcVar2);
    testing::internal::AssertHelper::operator=(&local_350,&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_350);
    testing::Message::~Message(&local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  cfd::core::ByteData160::~ByteData160((ByteData160 *)local_28);
  return;
}

Assistant:

TEST(HashUtil, Ripemd160) {
  ByteData160 byte_data;
  byte_data = HashUtil::Ripemd160(ByteData("0123456789abcdef"));
  EXPECT_STREQ(byte_data.GetHex().c_str(), "cea1b21f1a739fba68d1d4290437d2c5609be1d3");

  byte_data = HashUtil::Ripemd160(ByteData160("0123456789abcdef0123456789abcdef01234567"));
  EXPECT_STREQ(byte_data.GetHex().c_str(), "49ec9207a365f6f330d529ca2a79e23a7ea2b526");

  byte_data = HashUtil::Ripemd160(ByteData256("1234567890123456789012345678901234567890123456789012345678901234"));
  EXPECT_STREQ(byte_data.GetHex().c_str(), "a5b1c86f10c81c3c543304e9891815d8de036296");

  byte_data = HashUtil::Ripemd160(Pubkey("032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db"));
  EXPECT_STREQ(byte_data.GetHex().c_str(), "1c8eae98d10ae2eb0ce0a99d446f0156c6f596ca");

  byte_data = HashUtil::Ripemd160(Script("21026dccc749adc2a9d0d89497ac511f760f45c47dc5ed9cf352a58ac706453880aeadab210255a9626aebf5e29c0e6538428ba0d1dcf6ca98ffdf086aa8ced5e0d0215ea465ac"));
  EXPECT_STREQ(byte_data.GetHex().c_str(), "6be854f95bade5490a020c3841c50d08339a5c89");
}